

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es5503.c
# Opt level: O1

void es5503_pcm_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  ushort *puVar1;
  size_t __n;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  long lVar5;
  int iVar6;
  byte bVar7;
  ulong uVar8;
  int resshift;
  byte bVar9;
  ulong uVar10;
  UINT32 acc;
  uint local_6c;
  UINT32 local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  long local_50;
  ES5503Chip *local_48;
  ulong local_40;
  ulong local_38;
  
  local_38 = (ulong)samples;
  __n = local_38 * 4;
  local_68 = samples;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  if (*(char *)((long)param + 0x338) != '\0') {
    bVar9 = *(byte *)((long)param + 0x340) & 0xfe;
    lVar5 = (long)param + 0x38;
    uVar8 = 0;
    local_50 = lVar5;
    local_48 = (ES5503Chip *)param;
    do {
      bVar7 = *(byte *)(lVar5 + 4 + uVar8 * 0x18);
      if (((bVar7 & 1) == 0) &&
         (puVar1 = (ushort *)(lVar5 + uVar8 * 0x18), *(char *)((long)puVar1 + 0x15) == '\0')) {
        uVar10 = (ulong)((uint)(byte)puVar1[6] * 4);
        local_54 = *(uint *)((long)wavemasks + uVar10) & *(uint *)(puVar1 + 4);
        local_6c = *(uint *)(puVar1 + 8);
        if (local_68 != 0) {
          bVar7 = bVar7 >> 4 & ((ES5503Chip *)param)->outchn_mask;
          resshift = resshifts[*(byte *)((long)puVar1 + 0xd)] - (uint)(byte)puVar1[6];
          local_58 = *(uint *)((long)accmasks + uVar10);
          local_60 = (uint)*(byte *)((long)puVar1 + 5);
          local_5c = (uint)*puVar1;
          local_64 = puVar1[1] - 1 & 0xffff;
          uVar10 = 0;
          local_40 = uVar8;
          do {
            uVar3 = local_6c >> ((byte)resshift & 0x1f);
            local_6c = local_6c + local_5c;
            ((ES5503Chip *)param)->channel_strobe = (byte)puVar1[2] >> 4;
            bVar4 = ((ES5503Chip *)param)->docram[(uVar3 & local_58) + local_54];
            *(byte *)(puVar1 + 3) = bVar4;
            if (bVar4 == 0) {
              iVar6 = 1;
LAB_0016dc2f:
              es5503_halt_osc((ES5503Chip *)param,(int)uVar8,iVar6,&local_6c,resshift);
              uVar8 = local_40;
              param = local_48;
            }
            else {
              iVar6 = (bVar4 - 0x80) * local_60;
              bVar4 = 0;
              if (bVar9 != 0) {
                do {
                  if (bVar7 == bVar4) {
                    outputs[bVar4 & 1][uVar10] = outputs[bVar4 & 1][uVar10] + iVar6;
                  }
                  bVar4 = bVar4 + 1;
                } while (bVar9 != bVar4);
              }
              bVar2 = ((ES5503Chip *)param)->output_channels;
              if (bVar4 < bVar2) {
                iVar6 = iVar6 * 0xb5 >> 8;
                do {
                  if (bVar7 == bVar4) {
                    (*outputs)[uVar10] = (*outputs)[uVar10] + iVar6;
                    outputs[1][uVar10] = outputs[1][uVar10] + iVar6;
                  }
                  bVar4 = bVar4 + 1;
                } while (bVar4 < bVar2);
              }
              iVar6 = 0;
              if (local_64 <= uVar3) goto LAB_0016dc2f;
            }
          } while (((puVar1[2] & 1) == 0) && (uVar10 = uVar10 + 1, uVar10 < local_38));
        }
        *(uint *)(puVar1 + 8) = local_6c;
        lVar5 = local_50;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < ((ES5503Chip *)param)->oscsenabled);
  }
  return;
}

Assistant:

static void es5503_pcm_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	UINT8 osc;
	UINT32 snum;
	UINT32 ramptr;
	ES5503Chip *chip = (ES5503Chip *)param;
	UINT8 chnsStereo, chan;

	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));

	chnsStereo = chip->output_channels & ~1;
	for (osc = 0; osc < chip->oscsenabled; osc++)
	{
		ES5503Osc *pOsc = &chip->oscillators[osc];

		if (!(pOsc->control & 1) && ! pOsc->Muted)
		{
			UINT32 wtptr = pOsc->wavetblpointer & wavemasks[pOsc->wavetblsize];
			UINT32 altram;
			UINT32 acc = pOsc->accumulator;
			UINT16 wtsize = pOsc->wtsize - 1;
			UINT16 freq = pOsc->freq;
			INT16 vol = pOsc->vol;
			UINT8 chnMask = (pOsc->control >> 4) & 0x0F;
			int resshift = resshifts[pOsc->resolution] - pOsc->wavetblsize;
			UINT32 sizemask = accmasks[pOsc->wavetblsize];
			INT32 outData;

			chnMask &= chip->outchn_mask;
			for (snum = 0; snum < samples; snum++)
			{
				altram = acc >> resshift;
				ramptr = altram & sizemask;

				acc += freq;

				// channel strobe is always valid when reading; this allows potentially banking per voice
				chip->channel_strobe = (pOsc->control>>4) & 0xf;
				pOsc->data = chip->docram[ramptr + wtptr];

				if (pOsc->data == 0x00)
				{
					es5503_halt_osc(chip, osc, 1, &acc, resshift);
				}
				else
				{
					outData = (pOsc->data - 0x80) * vol;
					
					// send groups of 2 channels to L or R
					for (chan = 0; chan < chnsStereo; chan ++)
					{
						if (chan == chnMask)
							outputs[chan & 1][snum] += outData;
					}
					outData = (outData * 181) >> 8;	// outData *= sqrt(2)
					// send remaining channels to L+R
					for (; chan < chip->output_channels; chan ++)
					{
						if (chan == chnMask)
						{
							outputs[0][snum] += outData;
							outputs[1][snum] += outData;
						}
					}

					if (altram >= wtsize)
					{
						es5503_halt_osc(chip, osc, 0, &acc, resshift);
					}
				}

				// if oscillator halted, we've got no more samples to generate
				if (pOsc->control & 1)
				{
					pOsc->control |= 1;
					break;
				}
			}

			pOsc->accumulator = acc;
		}
	}
}